

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  scoped_padder p;
  scoped_padder local_40;
  
  uVar1 = ::fmt::v6::internal::count_digits(msg->thread_id);
  scoped_padder::scoped_padder(&local_40,(ulong)uVar1,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_long>(msg->thread_id,dest);
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = fmt_helper::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }